

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.h
# Opt level: O1

CSampleHandle __thiscall CSounds::GetSampleId(CSounds *this,int SetId)

{
  CGameClient *pCVar1;
  CDataSoundset *pCVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  CDataSound *pCVar7;
  int iVar8;
  
  pCVar1 = (this->super_CComponent).m_pClient;
  iVar8 = -1;
  if (pCVar1->m_pConfig->m_SndEnable != 0) {
    iVar4 = (*(pCVar1->m_pSound->super_IInterface)._vptr_IInterface[2])();
    if (((((char)iVar4 != '\0') && (-1 < SetId)) && (this->m_WaitForSoundJob == false)) &&
       (SetId < g_pData->m_NumSounds)) {
      pCVar2 = g_pData->m_aSounds;
      if (pCVar2[(uint)SetId].m_NumSounds != 0) {
        if (pCVar2[(uint)SetId].m_NumSounds == 1) {
          pCVar7 = pCVar2[(uint)SetId].m_aSounds;
        }
        else {
          do {
            uVar5 = rand();
            uVar6 = rand();
            uVar3 = (long)(ulong)((uVar5 & 0x7fff) << 0x10 | uVar6 & 0xffff) %
                    (long)pCVar2[(uint)SetId].m_NumSounds;
            iVar8 = (int)uVar3;
          } while (iVar8 == pCVar2[(uint)SetId].m_Last);
          pCVar2[(uint)SetId].m_Last = iVar8;
          pCVar7 = pCVar2[(uint)SetId].m_aSounds + (uVar3 & 0xffffffff);
        }
        iVar8 = (pCVar7->m_Id).m_Id;
      }
    }
  }
  return (CSampleHandle)iVar8;
}

Assistant:

class CConfig *Config() const { return m_pClient->Config(); }